

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constants.cpp
# Opt level: O2

Pointer __thiscall
dg::pta::LLVMPointerGraphBuilder::handleConstantArithmetic
          (LLVMPointerGraphBuilder *this,Instruction *Inst)

{
  char cVar1;
  Value VVar2;
  Use *pUVar3;
  PSNode *pPVar4;
  PSNodesSeq *pPVar5;
  Value *val;
  Pointer PVar6;
  const_iterator local_30;
  
  pUVar3 = llvm::User::getOperandList((User *)Inst);
  cVar1 = *(char *)(*(long *)pUVar3 + 0x10);
  pUVar3 = llvm::User::getOperandList((User *)Inst);
  val = *(Value **)(pUVar3 + 0x20);
  if (cVar1 == '\x10') {
LAB_0012e2d6:
    pPVar4 = getOperand(this,val);
  }
  else {
    VVar2 = val[0x10];
    pUVar3 = llvm::User::getOperandList((User *)Inst);
    val = *(Value **)pUVar3;
    if (VVar2 == (Value)0x10) goto LAB_0012e2d6;
    pPVar4 = tryGetOperand(this,val);
    if (pPVar4 == (PSNode *)0x0) {
      pUVar3 = llvm::User::getOperandList((User *)Inst);
      pPVar4 = tryGetOperand(this,*(Value **)(pUVar3 + 0x20));
      if (pPVar4 == (PSNode *)0x0) {
        pPVar5 = createUnknown(this,(Value *)Inst);
        pPVar4 = *(pPVar5->_nodes).
                  super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        goto LAB_0012e2fc;
      }
    }
  }
  ADT::
  SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
  ::begin(&local_30,&(pPVar4->pointsTo).pointers);
  PVar6 = PointerIdPointsToSet::const_iterator::operator*((const_iterator *)&local_30);
  pPVar4 = PVar6.target;
LAB_0012e2fc:
  PVar6.offset.offset = Offset::UNKNOWN.offset;
  PVar6.target = pPVar4;
  return PVar6;
}

Assistant:

Pointer LLVMPointerGraphBuilder::handleConstantArithmetic(
        const llvm::Instruction *Inst) {
    using namespace llvm;

    PSNode *op;

    if (isa<ConstantInt>(Inst->getOperand(0))) {
        op = getOperand(Inst->getOperand(1));
    } else if (isa<ConstantInt>(Inst->getOperand(1))) {
        op = getOperand(Inst->getOperand(0));
    } else {
        op = tryGetOperand(Inst->getOperand(0));
        if (!op)
            op = tryGetOperand(Inst->getOperand(1));

        if (!op)
            return Pointer{createUnknown(Inst).getSingleNode(),
                           Offset::UNKNOWN};
    }

    assert(op && "Don't have operand for add");
    assert(op->pointsTo.size() == 1 &&
           "Constant add with not only one pointer");

    Pointer ptr = *op->pointsTo.begin();
    return {ptr.target, Offset::UNKNOWN};
}